

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolve.c
# Opt level: O0

lys_node * resolve_choice_dflt(lys_node_choice *choic,char *dflt)

{
  lys_node *plVar1;
  lys_node *ret;
  lys_node *child;
  char *dflt_local;
  lys_node_choice *choic_local;
  
  ret = choic->child;
  while( true ) {
    if (ret == (lys_node *)0x0) {
      return (lys_node *)0x0;
    }
    if ((ret->nodetype == LYS_USES) &&
       (plVar1 = resolve_choice_dflt((lys_node_choice *)ret,dflt), plVar1 != (lys_node *)0x0))
    break;
    if ((ret->name == dflt) && ((ret->nodetype & 0x807f) != LYS_UNKNOWN)) {
      return ret;
    }
    ret = ret->next;
  }
  return plVar1;
}

Assistant:

static struct lys_node *
resolve_choice_dflt(struct lys_node_choice *choic, const char *dflt)
{
    struct lys_node *child, *ret;

    LY_TREE_FOR(choic->child, child) {
        if (child->nodetype == LYS_USES) {
            ret = resolve_choice_dflt((struct lys_node_choice *)child, dflt);
            if (ret) {
                return ret;
            }
        }

        if (ly_strequal(child->name, dflt, 1) && (child->nodetype & (LYS_ANYDATA | LYS_CASE
                | LYS_CONTAINER | LYS_LEAF | LYS_LEAFLIST | LYS_LIST | LYS_CHOICE))) {
            return child;
        }
    }

    return NULL;
}